

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionContext_BlindTransaction_Test::TestBody
          (ConfidentialTransactionContext_BlindTransaction_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  char *pcVar3;
  char *in_R9;
  undefined8 in_stack_fffffffffffff038;
  IssuanceOutputParameter *this_00;
  undefined4 uVar4;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> unblind_param;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  long local_f38;
  char local_f28 [16];
  Amount local_f18 [16];
  map<cfd::core::OutPoint,_cfd::core::UnblindParameter,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
  utxo_info_map;
  long local_ed8;
  map<cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
  issuance_key_map;
  OutPoint outpoint;
  IssuanceBlindingKeyPair issue_key;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  confidential_key_list;
  BlindParameter utxo_param;
  Privkey master_blinding_key;
  ByteData256 contract_hash;
  string tx_base;
  IssuanceParameter param;
  ConfidentialTransactionContext tx;
  IssuanceOutputParameter issue_output;
  IssuanceOutputParameter token_output;
  ElementsConfidentialAddress address;
  ElementsConfidentialAddress token_address;
  ElementsConfidentialAddress asset_address;
  
  uVar4 = (undefined4)((ulong)in_stack_fffffffffffff038 >> 0x20);
  std::__cxx11::string::string
            ((string *)&tx_base,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,(allocator *)&issue_output);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&tx,(string *)&tx_base);
  std::__cxx11::string::string
            ((string *)&token_output,
             "c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f",
             (allocator *)&address);
  cfd::core::Txid::Txid((Txid *)&issue_output,(string *)&token_output);
  cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&issue_output,1);
  cfd::core::Txid::~Txid((Txid *)&issue_output);
  std::__cxx11::string::~string((string *)&token_output);
  local_f18._0_8_ = cfd::core::Amount::CreateByCoinAmount(100.0);
  local_f18[8] = (Amount)extraout_DL;
  local_f28._0_8_ = cfd::core::Amount::CreateByCoinAmount(10.0);
  local_f28[8] = extraout_DL_00;
  std::__cxx11::string::string
            ((string *)&issue_output,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz",
             (allocator *)&token_output);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&address,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS",
             (allocator *)&token_output);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&asset_address,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  std::__cxx11::string::string
            ((string *)&issue_output,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3jM5PWewjAYfWsrxrGeKAxWw6JsEGLjWym",
             (allocator *)&token_output);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&token_address,(string *)&issue_output);
  std::__cxx11::string::~string((string *)&issue_output);
  cfd::core::ByteData256::ByteData256(&contract_hash);
  cfd::core::IssuanceParameter::IssuanceParameter(&param);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(&issue_output);
  this_00 = &token_output;
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(this_00);
  cfd::core::ElementsConfidentialAddress::operator=
            (&issue_output.confidential_address,&asset_address);
  issue_output._872_1_ = local_f18[8];
  issue_output.amount = local_f18[0];
  issue_output._865_1_ = local_f18[1];
  issue_output._866_1_ = local_f18[2];
  issue_output._867_1_ = local_f18[3];
  issue_output._868_1_ = local_f18[4];
  issue_output._869_1_ = local_f18[5];
  issue_output._870_1_ = local_f18[6];
  issue_output._871_1_ = local_f18[7];
  cfd::core::ElementsConfidentialAddress::operator=
            (&token_output.confidential_address,&token_address);
  token_output._872_1_ = local_f28[8];
  token_output.amount = (Amount)local_f28[0];
  token_output._865_1_ = local_f28[1];
  token_output._866_1_ = local_f28[2];
  token_output._867_1_ = local_f28[3];
  token_output._868_1_ = local_f28[4];
  token_output._869_1_ = local_f28[5];
  token_output._870_1_ = local_f28[6];
  token_output._871_1_ = local_f28[7];
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_R9 = local_f28;
      cfd::ConfidentialTransactionContext::SetAssetIssuance
                ((OutPoint *)&utxo_param,(Amount *)&tx,(IssuanceOutputParameter *)&outpoint,
                 local_f18,&issue_output,SUB81(in_R9,0),(ByteData256 *)this_00);
      uVar4 = (undefined4)((ulong)this_00 >> 0x20);
      cfd::core::IssuanceParameter::operator=(&param,(IssuanceParameter *)&utxo_param);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&utxo_param);
    }
  }
  else {
    testing::Message::Message((Message *)&utxo_param);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&issue_key,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x22c,
               "Expected: (param = tx.SetAssetIssuance(outpoint, asset_amount, issue_output, token_amount, token_output, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&issue_key,(Message *)&utxo_param);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&issue_key);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&utxo_param);
  }
  std::__cxx11::string::string
            ((string *)&utxo_param,
             "fbbd7894006dd0e02000eb6646c6685bcceddabc8d68b93e9a1a2c78d1e7bbec",
             (allocator *)&issue_key);
  cfd::core::Privkey::Privkey(&master_blinding_key,(string *)&utxo_param,kMainnet,true);
  std::__cxx11::string::~string((string *)&utxo_param);
  cfd::core::IssuanceBlindingKeyPair::IssuanceBlindingKeyPair(&issue_key);
  cfd::core::OutPoint::GetTxid();
  cfd::core::OutPoint::GetVout();
  cfd::core::ConfidentialTransaction::GetIssuanceBlindingKey
            ((Privkey *)&utxo_param,(Txid *)&master_blinding_key,(uint)&utxo_info_map);
  cfd::core::Privkey::operator=(&issue_key.asset_key,(Privkey *)&utxo_param);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&utxo_param);
  cfd::core::Txid::~Txid((Txid *)&utxo_info_map);
  cfd::core::Privkey::operator=(&issue_key.token_key,&issue_key.asset_key);
  cfd::core::UnblindParameter::UnblindParameter(&utxo_param);
  std::__cxx11::string::string
            ((string *)&issuance_key_map,
             "849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",
             (allocator *)&gtest_ar_1);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&utxo_info_map,(string *)&issuance_key_map);
  cfd::core::ConfidentialAssetId::operator=(&utxo_param.asset,(ConfidentialAssetId *)&utxo_info_map)
  ;
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&utxo_info_map);
  std::__cxx11::string::~string((string *)&issuance_key_map);
  cfd::core::Amount::Amount((Amount *)&issuance_key_map,0x2faa260);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)&utxo_info_map,(Amount *)&issuance_key_map);
  cfd::core::ConfidentialValue::operator=(&utxo_param.value,(ConfidentialValue *)&utxo_info_map);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&utxo_info_map);
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header;
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       utxo_info_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>>
  ::_M_emplace_unique<cfd::core::OutPoint&,cfd::core::UnblindParameter&>
            ((_Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::UnblindParameter>>>
              *)&utxo_info_map,&outpoint,&utxo_param);
  issuance_key_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &issuance_key_map._M_t._M_impl.super__Rb_tree_header._M_header;
  issuance_key_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  issuance_key_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  issuance_key_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  issuance_key_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       issuance_key_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::IssuanceBlindingKeyPair>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::IssuanceBlindingKeyPair>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::IssuanceBlindingKeyPair>>>
  ::_M_emplace_unique<cfd::core::OutPoint&,cfd::core::IssuanceBlindingKeyPair&>
            ((_Rb_tree<cfd::core::OutPoint,std::pair<cfd::core::OutPoint_const,cfd::core::IssuanceBlindingKeyPair>,std::_Select1st<std::pair<cfd::core::OutPoint_const,cfd::core::IssuanceBlindingKeyPair>>,std::less<cfd::core::OutPoint>,std::allocator<std::pair<cfd::core::OutPoint_const,cfd::core::IssuanceBlindingKeyPair>>>
              *)&issuance_key_map,&outpoint,&issue_key);
  confidential_key_list.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  confidential_key_list.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  confidential_key_list.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&confidential_key_list,&address);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_R9 = (char *)0x0;
      cfd::ConfidentialTransactionContext::BlindTransaction
                ((map *)&tx,(map *)&utxo_info_map,(vector *)&issuance_key_map,
                 (long)&confidential_key_list,1,0,(vector *)CONCAT44(uVar4,0x34));
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x240,
               "Expected: tx.BlindTransaction( utxo_info_map, issuance_key_map, confidential_key_list) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  _txouts = gtest_ar_1.message_.ptr_;
  unblind_param.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(unblind_param.
                         super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,0xabde);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"tx.GetHex().size()","43998",(unsigned_long *)&txouts,
             (int *)&unblind_param);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&txouts,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x241,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&txouts,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&txouts);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ConfidentialTransaction::GetTxOutList();
  gtest_ar._0_8_ = (local_f38 - (long)_txouts) / 0xf8;
  unblind_param.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(unblind_param.
                         super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar_1,"txouts.size()","4",(unsigned_long *)&gtest_ar,
             (int *)&unblind_param);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&unblind_param,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x243,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&unblind_param,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unblind_param);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  if (local_f38 - (long)_txouts == 0x3e0) {
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar_1,(ConfidentialValue *)((long)&_txouts[3].field_2 + 8)
              );
    bVar1 = (bool)cfd::core::ConfidentialValue::HasBlinding();
    gtest_ar.success_ = bVar1;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&unblind_param);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x245,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_2,(Message *)&unblind_param);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&unblind_param);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar_1,(ConfidentialValue *)&_txouts[0xb].field_2);
    uVar2 = cfd::core::ConfidentialValue::HasBlinding();
    gtest_ar._0_8_ = CONCAT71(gtest_ar._1_7_,uVar2) ^ 1;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&unblind_param);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","true","false",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x246,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_2,(Message *)&unblind_param);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&unblind_param);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar_1,(ConfidentialValue *)&_txouts[0x13]._M_string_length
              );
    bVar1 = (bool)cfd::core::ConfidentialValue::HasBlinding();
    gtest_ar.success_ = bVar1;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&unblind_param);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x247,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_2,(Message *)&unblind_param);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&unblind_param);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&gtest_ar_1,(ConfidentialValue *)(_txouts + 0x1b));
    bVar1 = (bool)cfd::core::ConfidentialValue::HasBlinding();
    gtest_ar.success_ = bVar1;
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&gtest_ar_1);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&unblind_param);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1,(internal *)&gtest_ar,
                 (AssertionResult *)"txouts[3].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x248,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_2,(Message *)&unblind_param);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
      std::__cxx11::string::~string((string *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&unblind_param);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
  }
  unblind_param.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unblind_param.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unblind_param.
  super__Vector_base<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::UnblindIssuance
                ((OutPoint *)&gtest_ar_1,(IssuanceBlindingKeyPair *)&tx);
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      _M_move_assign(&unblind_param,&gtest_ar_1);
      std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::
      ~vector((vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_> *)
              &gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x24d,
               "Expected: unblind_param = tx.UnblindIssuance(outpoint, issue_key) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar3 = (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"unblind_param[0].asset.GetHex().c_str()",
             "param.asset.GetHex().c_str()",pcVar3,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x24e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar._0_8_ = cfd::core::ConfidentialValue::GetAmount();
  gtest_ar.message_.ptr_._0_1_ = extraout_DL_01;
  gtest_ar_2._0_8_ = cfd::core::Amount::GetSatoshiValue();
  local_ed8 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_1,"unblind_param[0].value.GetAmount().GetSatoshiValue()",
             "asset_amount.GetSatoshiValue()",(long *)&gtest_ar_2,&local_ed8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x24f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  pcVar3 = (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_2,"unblind_param[1].asset.GetHex().c_str()",
             "param.token.GetHex().c_str()",pcVar3,(char *)gtest_ar._0_8_);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  if (gtest_ar_2.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar_2.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_2.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x250,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_2.message_);
  gtest_ar._0_8_ = cfd::core::ConfidentialValue::GetAmount();
  gtest_ar.message_.ptr_._0_1_ = extraout_DL_02;
  gtest_ar_2._0_8_ = cfd::core::Amount::GetSatoshiValue();
  local_ed8 = cfd::core::Amount::GetSatoshiValue();
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)&gtest_ar_1,"unblind_param[1].value.GetAmount().GetSatoshiValue()",
             "token_amount.GetSatoshiValue()",(long *)&gtest_ar_2,&local_ed8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x251,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::vector<cfd::core::UnblindParameter,_std::allocator<cfd::core::UnblindParameter>_>::~vector
            (&unblind_param);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&txouts);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&confidential_key_list);
  std::
  _Rb_tree<cfd::core::OutPoint,_std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>,_std::_Select1st<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::IssuanceBlindingKeyPair>_>_>
  ::~_Rb_tree(&issuance_key_map._M_t);
  std::
  _Rb_tree<cfd::core::OutPoint,_std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>,_std::_Select1st<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>,_std::less<cfd::core::OutPoint>,_std::allocator<std::pair<const_cfd::core::OutPoint,_cfd::core::UnblindParameter>_>_>
  ::~_Rb_tree(&utxo_info_map._M_t);
  cfd::core::UnblindParameter::~UnblindParameter(&utxo_param);
  cfd::core::IssuanceBlindingKeyPair::~IssuanceBlindingKeyPair(&issue_key);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&master_blinding_key);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&token_output);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&issue_output);
  cfd::core::IssuanceParameter::~IssuanceParameter(&param);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&token_address);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&asset_address);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&address);
  cfd::core::Txid::~Txid(&outpoint.txid_);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&tx);
  std::__cxx11::string::~string((string *)&tx_base);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, BlindTransaction)
{
  std::string tx_base =
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec001976a9149157a10c10924d7550ee7079cda55db1d11a278a88ac0135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000";

  // blinding key
  // pubkey: '02283059264b09d28d56d440f11ab69c9af8f09dfd8b0c3b30acc545fc0a5c6d13',
  // privkey: '0245a1b3f51d6fe1c4bddc6764cf98a0fe50dba470b8b28c47485112c3f8c9b5'

  // set issue
  ConfidentialTransactionContext tx(tx_base);
  OutPoint outpoint(Txid("c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f"), 1);
  Amount asset_amount = Amount::CreateByCoinAmount(100.0);
  Amount token_amount = Amount::CreateByCoinAmount(10.0);
  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  // pubkey: '023c10299d5e5e7586694f5bdf74535e4fdade72f266ed56f761cf7b1e4c61dad4',
  // privkey: 'cUbox87hNNTuqTACDBc6YKU2mA21Pqt6BjZGVogusp766QVxypKg'
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");
  // "2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG"
  ElementsConfidentialAddress token_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3jM5PWewjAYfWsrxrGeKAxWw6JsEGLjWym");
  ByteData256 contract_hash;
  bool is_blind = true;
  IssuanceParameter param;
  IssuanceOutputParameter issue_output;
  IssuanceOutputParameter token_output;
  issue_output.confidential_address = asset_address;
  issue_output.amount = asset_amount;
  token_output.confidential_address = token_address;
  token_output.amount = token_amount;
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(outpoint, asset_amount,
                                   issue_output, token_amount,
                                   token_output, is_blind,
                                   contract_hash)));

  Privkey master_blinding_key("fbbd7894006dd0e02000eb6646c6685bcceddabc8d68b93e9a1a2c78d1e7bbec");
  IssuanceBlindingKeyPair issue_key;
  issue_key.asset_key = ConfidentialTransaction::GetIssuanceBlindingKey(
      master_blinding_key, outpoint.GetTxid(), outpoint.GetVout());
  issue_key.token_key = issue_key.asset_key;
  BlindParameter utxo_param;
  utxo_param.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  utxo_param.value = ConfidentialValue(Amount(int64_t{49980000}));

  std::map<OutPoint, BlindParameter> utxo_info_map;
  utxo_info_map.emplace(outpoint, utxo_param);
  std::map<OutPoint, IssuanceBlindingKeyPair> issuance_key_map;
  issuance_key_map.emplace(outpoint, issue_key);
  std::vector<ElementsConfidentialAddress> confidential_key_list;
  confidential_key_list.push_back(address);
  // confidential_key_list.push_back(asset_address);
  // confidential_key_list.push_back(token_address);
  EXPECT_NO_THROW(tx.BlindTransaction(
      utxo_info_map, issuance_key_map, confidential_key_list));
  EXPECT_EQ(tx.GetHex().size(), 43998);
  std::vector<ConfidentialTxOutReference> txouts = tx.GetTxOutList();
  EXPECT_EQ(txouts.size(), 4);
  if (txouts.size() == 4) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[2].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[3].GetConfidentialValue().HasBlinding());
  }
  // EXPECT_STREQ(tx.GetHex().c_str(), "");

  std::vector<UnblindParameter> unblind_param;
  EXPECT_NO_THROW(unblind_param = tx.UnblindIssuance(outpoint, issue_key));
  EXPECT_STREQ(unblind_param[0].asset.GetHex().c_str(), param.asset.GetHex().c_str());
  EXPECT_EQ(unblind_param[0].value.GetAmount().GetSatoshiValue(), asset_amount.GetSatoshiValue());
  EXPECT_STREQ(unblind_param[1].asset.GetHex().c_str(), param.token.GetHex().c_str());
  EXPECT_EQ(unblind_param[1].value.GetAmount().GetSatoshiValue(), token_amount.GetSatoshiValue());
}